

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O2

int MRIStepResize(void *arkode_mem,N_Vector y0,realtype t0,ARKVecResizeFn resize,void *resize_data)

{
  int iVar1;
  SUNNonlinearSolver NLS;
  int lrw_diff;
  char *msgfmt;
  int liw_diff;
  sunindextype liw1;
  sunindextype lrw1;
  ARKodeMRIStepMem step_mem;
  ARKodeMem ark_mem;
  
  iVar1 = mriStep_AccessStepMem(arkode_mem,"MRIStepResize",&ark_mem,&step_mem);
  if (iVar1 != 0) {
    return iVar1;
  }
  liw1 = 0;
  lrw1 = 0;
  if (y0->ops->nvspace != (_func_void_N_Vector_sunindextype_ptr_sunindextype_ptr *)0x0) {
    N_VSpace(y0,&lrw1,&liw1);
  }
  lrw_diff = lrw1 - ark_mem->lrw1;
  liw_diff = liw1 - ark_mem->liw1;
  ark_mem->lrw1 = lrw1;
  ark_mem->liw1 = liw1;
  iVar1 = arkResize(ark_mem,y0,1.0,t0,resize,resize_data);
  if (iVar1 != 0) {
    msgfmt = "Unable to resize main ARKode infrastructure";
    goto LAB_004b1367;
  }
  if ((((((step_mem->Fse == (N_Vector *)0x0) ||
         (iVar1 = arkResizeVecArray(resize,resize_data,step_mem->nstages_stored,y0,&step_mem->Fse,
                                    lrw_diff,&ark_mem->lrw,liw_diff,&ark_mem->liw), iVar1 != 0)) &&
        ((step_mem->Fsi == (N_Vector *)0x0 ||
         (iVar1 = arkResizeVecArray(resize,resize_data,step_mem->nstages_stored,y0,&step_mem->Fsi,
                                    lrw_diff,&ark_mem->lrw,liw_diff,&ark_mem->liw), iVar1 != 0))))
       && ((step_mem->sdata == (N_Vector)0x0 ||
           (iVar1 = arkResizeVec(ark_mem,resize,resize_data,lrw_diff,liw_diff,y0,&step_mem->sdata),
           iVar1 != 0)))) &&
      ((step_mem->zpred == (N_Vector)0x0 ||
       (iVar1 = arkResizeVec(ark_mem,resize,resize_data,lrw_diff,liw_diff,y0,&step_mem->zpred),
       iVar1 != 0)))) &&
     ((step_mem->zcor == (N_Vector)0x0 ||
      (iVar1 = arkResizeVec(ark_mem,resize,resize_data,lrw_diff,liw_diff,y0,&step_mem->zcor),
      iVar1 != 0)))) {
    if ((step_mem->NLS == (SUNNonlinearSolver)0x0) || (step_mem->ownNLS == 0)) {
LAB_004b132e:
      iVar1 = mriStepInnerStepper_Resize(step_mem->stepper,resize,resize_data,lrw_diff,liw_diff,y0);
      if (iVar1 == 0) {
        if (step_mem->NLS == (SUNNonlinearSolver)0x0) {
          return 0;
        }
        step_mem->nsetups = 0;
        return 0;
      }
      goto LAB_004b134e;
    }
    iVar1 = SUNNonlinSolFree(step_mem->NLS);
    if (iVar1 != 0) {
      return iVar1;
    }
    step_mem->NLS = (SUNNonlinearSolver)0x0;
    step_mem->ownNLS = 0;
    NLS = SUNNonlinSol_Newton(y0,ark_mem->sunctx);
    if (NLS == (SUNNonlinearSolver)0x0) {
      msgfmt = "Error creating default Newton solver";
    }
    else {
      iVar1 = MRIStepSetNonlinearSolver(ark_mem,NLS);
      if (iVar1 == 0) {
        step_mem->ownNLS = 1;
        goto LAB_004b132e;
      }
      msgfmt = "Error attaching default Newton solver";
    }
  }
  else {
LAB_004b134e:
    msgfmt = "Unable to resize vector";
  }
  iVar1 = -0x14;
LAB_004b1367:
  arkProcessError(ark_mem,iVar1,"ARKode::MRIStep","MRIStepResize",msgfmt);
  return iVar1;
}

Assistant:

int MRIStepResize(void *arkode_mem, N_Vector y0, realtype t0,
                  ARKVecResizeFn resize, void *resize_data)
{
  ARKodeMem ark_mem;
  ARKodeMRIStepMem step_mem;
  SUNNonlinearSolver NLS;
  sunindextype lrw1, liw1, lrw_diff, liw_diff;
  int retval;

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(arkode_mem, "MRIStepResize",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) return(retval);

  /* Determing change in vector sizes */
  lrw1 = liw1 = 0;
  if (y0->ops->nvspace != NULL)
    N_VSpace(y0, &lrw1, &liw1);
  lrw_diff = lrw1 - ark_mem->lrw1;
  liw_diff = liw1 - ark_mem->liw1;
  ark_mem->lrw1 = lrw1;
  ark_mem->liw1 = liw1;

  /* resize ARKode infrastructure memory (use hscale = 1.0) */
  retval = arkResize(ark_mem, y0, RCONST(1.0), t0, resize, resize_data);
  if (retval != ARK_SUCCESS) {
    arkProcessError(ark_mem, retval, "ARKode::MRIStep", "MRIStepResize",
                    "Unable to resize main ARKode infrastructure");
    return(retval);
  }

  /* Resize Fse */
  if (step_mem->Fse) {
    if (!arkResizeVecArray(resize, resize_data,
                           step_mem->nstages_stored, y0, &(step_mem->Fse),
                           lrw_diff, &(ark_mem->lrw),
                           liw_diff, &(ark_mem->liw))) {
      arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode::MRIStep",
                      "MRIStepResize", "Unable to resize vector");
      return(ARK_MEM_FAIL);
    }
  }

  /* Resize Fsi */
  if (step_mem->Fsi) {
    if (!arkResizeVecArray(resize, resize_data,
                           step_mem->nstages_stored, y0, &(step_mem->Fsi),
                           lrw_diff, &(ark_mem->lrw),
                           liw_diff, &(ark_mem->liw))) {
      arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode::MRIStep",
                      "MRIStepResize", "Unable to resize vector");
      return(ARK_MEM_FAIL);
    }
  }

  /* Resize the nonlinear solver interface vectors (if applicable) */
  if (step_mem->sdata != NULL)
    if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff,
                      liw_diff, y0, &step_mem->sdata)) {
      arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode::MRIStep",
                      "MRIStepResize", "Unable to resize vector");
      return(ARK_MEM_FAIL);
    }
  if (step_mem->zpred != NULL)
    if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff,
                      liw_diff, y0, &step_mem->zpred)) {
      arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode::MRIStep",
                      "MRIStepResize", "Unable to resize vector");
      return(ARK_MEM_FAIL);
    }
  if (step_mem->zcor != NULL)
    if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff,
                      liw_diff, y0, &step_mem->zcor)) {
      arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode::MRIStep",
                      "MRIStepResize", "Unable to resize vector");
      return(ARK_MEM_FAIL);
    }

  /* If a NLS object was previously used, destroy and recreate default Newton
     NLS object (can be replaced by user-defined object if desired) */
  if ((step_mem->NLS != NULL) && (step_mem->ownNLS)) {

    /* destroy existing NLS object */
    retval = SUNNonlinSolFree(step_mem->NLS);
    if (retval != ARK_SUCCESS)  return(retval);
    step_mem->NLS = NULL;
    step_mem->ownNLS = SUNFALSE;

    /* create new Newton NLS object */
    NLS = SUNNonlinSol_Newton(y0, ark_mem->sunctx);
    if (NLS == NULL) {
      arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode::MRIStep",
                      "MRIStepResize", "Error creating default Newton solver");
      return(ARK_MEM_FAIL);
    }

    /* attach new Newton NLS object to MRIStep */
    retval = MRIStepSetNonlinearSolver(ark_mem, NLS);
    if (retval != ARK_SUCCESS) {
      arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode::MRIStep",
                      "MRIStepResize", "Error attaching default Newton solver");
      return(ARK_MEM_FAIL);
    }
    step_mem->ownNLS = SUNTRUE;

  }

  /* Resize the inner stepper vectors */
  retval = mriStepInnerStepper_Resize(step_mem->stepper, resize, resize_data,
                                      lrw_diff, liw_diff, y0);
  if (retval != ARK_SUCCESS) {
    arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode::MRIStep",
                    "MRIStepResize", "Unable to resize vector");
    return(ARK_MEM_FAIL);
  }

  /* reset nonlinear solver counters */
  if (step_mem->NLS != NULL)  step_mem->nsetups = 0;

  return(ARK_SUCCESS);
}